

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeCommandListCreateImmediate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_queue_desc_t *altdesc,
          ze_command_list_handle_t *phCommandList)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  bool bVar10;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  plVar9 = local_58;
  local_68[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeCommandListCreateImmediate(hContext, hDevice, altdesc, phCommandList)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != plVar9) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(context + 0x220);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar3 = *(long *)(context + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar10 = lVar3 != lVar6;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        zVar5 = (**(code **)(*plVar4 + 0x240))(plVar4,hContext,hDevice,altdesc,phCommandList);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListCreateImmediate",zVar5);
          plVar9 = (long *)(ulong)zVar5;
          break;
        }
        bVar10 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    local_9c = (ze_result_t)plVar9;
    if (bVar10) {
      return local_9c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZEHandleLifetimeValidation::zeCommandListCreateImmediatePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,
                           altdesc,phCommandList), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeCommandListCreateImmediate",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hContext,hDevice,altdesc,phCommandList);
    bVar10 = lVar3 != lVar6;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar9 = (long *)**(undefined8 **)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8);
        result = (**(code **)(*plVar9 + 0x248))(plVar9,hContext,hDevice,altdesc,phCommandList,zVar5)
        ;
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListCreateImmediate",result);
          local_9c = result;
          break;
        }
        bVar10 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar10) {
      return local_9c;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phCommandList != (ze_command_list_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phCommandList,false);
    }
  }
  logAndPropagateResult("zeCommandListCreateImmediate",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreateImmediate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_queue_desc_t* altdesc,         ///< [in] pointer to command queue descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        context.logger->log_trace("zeCommandListCreateImmediate(hContext, hDevice, altdesc, phCommandList)");

        auto pfnCreateImmediate = context.zeDdiTable.CommandList.pfnCreateImmediate;

        if( nullptr == pfnCreateImmediate )
            return logAndPropagateResult("zeCommandListCreateImmediate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateImmediatePrologue( hContext, hDevice, altdesc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreateImmediatePrologue( hContext, hDevice, altdesc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }

        auto driver_result = pfnCreateImmediate( hContext, hDevice, altdesc, phCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateImmediateEpilogue( hContext, hDevice, altdesc, phCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateImmediate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phCommandList){
                context.handleLifetime->addHandle( *phCommandList , false);
            }
        }
        return logAndPropagateResult("zeCommandListCreateImmediate", driver_result);
    }